

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

void compute_ui_entry_values_for_object
               (ui_entry *entry,object *obj,player *p,cached_object_data **cache,int *val,
               int *auxval)

{
  byte bVar1;
  curse_data *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  _Bool _Var9;
  int iVar10;
  cached_object_data *pcVar11;
  bound_object_property *pbVar12;
  wchar_t wVar13;
  long lVar14;
  long lVar15;
  wchar_t wVar16;
  long lVar17;
  byte local_c1;
  int local_b4;
  wchar_t local_a4;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  
  cst.work = (void *)0x0;
  cst.accum = L'\0';
  cst.accum_aux = L'\0';
  if ((obj == (object *)0x0) || (entry->n_obj_prop == L'\0')) {
    *val = 0x7ffffffe;
    cst.accum_aux = L'\x7ffffffe';
    goto LAB_001d384b;
  }
  if (*cache == (cached_object_data *)0x0) {
    pcVar11 = (cached_object_data *)mem_alloc(6);
    *cache = pcVar11;
    flag_wipe((bitflag *)pcVar11,6);
    if (p == (player *)0x0) {
      object_flags(obj,(*cache)->f);
    }
    else {
      object_flags_known(obj,(*cache)->f);
    }
  }
  iVar10 = ui_entry_combiner_get_funcs(entry->combiner_index,(ui_entry_combiner_funcs *)&combiner);
  if (iVar10 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                  ,0x27b,
                  "void compute_ui_entry_values_for_object(const struct ui_entry *, const struct object *, const struct player *, struct cached_object_data **, int *, int *)"
                 );
  }
  pcVar11 = *cache;
  pcVar2 = obj->curses;
  bVar4 = true;
  bVar3 = true;
  local_c1 = 1;
  bVar6 = false;
  bVar5 = false;
  local_b4 = 0;
  local_a4 = L'\0';
  bVar8 = true;
LAB_001d3392:
  if (obj != (object *)0x0) {
    lVar15 = 0xd;
    for (lVar17 = 0; lVar17 < entry->n_obj_prop; lVar17 = lVar17 + 1) {
      pbVar12 = entry->obj_props;
      wVar16 = *(wchar_t *)((long)pbVar12 + lVar15 + -9);
      bVar1 = *(byte *)((long)&pbVar12->type + lVar15);
      if (bVar1 == 1) {
        bVar7 = true;
        if ((entry->flags & L'\x01') == L'\0') goto LAB_001d33ea;
      }
      else {
        bVar4 = false;
        bVar7 = bVar6;
LAB_001d33ea:
        bVar6 = bVar7;
        switch(*(undefined4 *)((long)pbVar12 + lVar15 + -0xd)) {
        case 1:
        case 2:
          if (((p != (player *)0x0) && (p->obj_k->modifiers[wVar16] == 0)) &&
             (obj->modifiers[wVar16] != 0)) goto LAB_001d3654;
          wVar13 = (wchar_t)obj->modifiers[wVar16];
          if (obj->modifiers[wVar16] == 0) {
            wVar13 = L'\0';
          }
          else if (*(char *)((long)pbVar12 + lVar15 + -1) == '\x01') {
            wVar13 = *(wchar_t *)((long)pbVar12 + lVar15 + -5);
          }
          wVar16 = wVar13;
          if (bVar1 != 0) {
            bVar3 = false;
            wVar16 = L'\0';
          }
          if (bVar1 == 0) {
            wVar13 = L'\0';
          }
LAB_001d3612:
          local_c1 = local_c1 & bVar1;
          if (bVar8) {
            (*combiner.init_func)(wVar16,wVar13,&cst);
            bVar8 = false;
          }
          else {
            (*combiner.accum_func)(wVar16,wVar13,&cst);
          }
          break;
        case 3:
          if ((p == (player *)0x0) || (_Var9 = object_flag_is_known(p,obj,wVar16), _Var9)) {
            _Var9 = flag_has_dbg(pcVar11->f,6,wVar16,"cache2->f","ind");
            pbVar12 = entry->obj_props;
            wVar13 = L'\0';
            if ((_Var9) && (wVar13 = L'\x01', *(char *)((long)pbVar12 + lVar15 + -1) == '\x01')) {
              wVar13 = *(wchar_t *)((long)pbVar12 + lVar15 + -5);
            }
            bVar1 = *(byte *)((long)&pbVar12->type + lVar15);
            wVar16 = wVar13;
            if (bVar1 != 0) {
              wVar16 = L'\0';
              bVar3 = false;
            }
            if (bVar1 == 0) {
              wVar13 = L'\0';
            }
            goto LAB_001d3612;
          }
LAB_001d3654:
          if (0 < local_b4) {
            bVar5 = true;
          }
          break;
        case 4:
          if (p != (player *)0x0) {
            _Var9 = object_element_is_known(p,obj,wVar16);
            if (!_Var9) {
              if (0 < local_b4) {
                bVar5 = true;
              }
              local_a4 = L'd';
              break;
            }
            pbVar12 = entry->obj_props;
          }
          wVar13 = (wchar_t)obj->el_info[wVar16].res_level;
          local_a4 = L'd';
          wVar16 = local_a4;
          if ((wVar13 != L'd') &&
             (wVar16 = wVar13, *(char *)((long)pbVar12 + lVar15 + -1) == '\x01')) {
            wVar16 = *(wchar_t *)((long)pbVar12 + lVar15 + -5);
          }
          bVar1 = *(byte *)((long)&pbVar12->type + lVar15);
          local_c1 = local_c1 & bVar1;
          if (bVar1 == 0) {
            wVar13 = L'd';
          }
          else {
            wVar13 = wVar16;
            wVar16 = L'd';
            bVar3 = false;
          }
          if (bVar8) {
            (*combiner.init_func)(wVar16,wVar13,&cst);
            bVar8 = false;
          }
          else {
            (*combiner.accum_func)(wVar16,wVar13,&cst);
          }
          break;
        case 5:
          if (p != (player *)0x0) {
            _Var9 = object_element_is_known(p,obj,wVar16);
            if (!_Var9) {
              if (0 < local_b4) {
                bVar5 = true;
              }
              break;
            }
            pbVar12 = entry->obj_props;
          }
          bVar1 = obj->el_info[wVar16].flags;
          wVar16 = (bVar1 & 2) >> 1;
          if (((bVar1 & 2) != 0) && (*(char *)((long)pbVar12 + lVar15 + -1) == '\x01')) {
            wVar16 = *(wchar_t *)((long)pbVar12 + lVar15 + -5);
          }
          bVar1 = *(byte *)((long)&pbVar12->type + lVar15);
          local_c1 = local_c1 & bVar1;
          wVar13 = wVar16;
          if (bVar1 != 0) {
            bVar3 = false;
            wVar13 = L'\0';
          }
          if (bVar1 == 0) {
            wVar16 = L'\0';
          }
          if (bVar8) {
            (*combiner.init_func)(wVar13,wVar16,&cst);
            bVar8 = false;
          }
          else {
            (*combiner.accum_func)(wVar13,wVar16,&cst);
          }
        }
      }
      lVar15 = lVar15 + 0x10;
    }
    obj = (object *)0x0;
    if (pcVar2 != (curse_data *)0x0) {
      if (local_b4 == 0) {
        pcVar11 = (cached_object_data *)mem_alloc(6);
      }
      lVar17 = (long)local_b4;
      lVar15 = lVar17 * 7 + 3;
      do {
        lVar14 = lVar15;
        lVar17 = lVar17 + 1;
        local_b4 = (int)lVar17;
        if ((long)(ulong)z_info->curse_max <= lVar17) {
          mem_free(pcVar11);
          obj = (object *)0x0;
          goto LAB_001d3392;
        }
        lVar15 = lVar14 + 7;
      } while (pcVar2[lVar17].power == L'\0');
      obj = *(object **)(curses[1].conflict_flags + lVar14 * 8 + -0x28);
      flag_wipe(pcVar11->f,6);
      if (p == (player *)0x0) {
        object_flags(obj,pcVar11->f);
      }
      else {
        object_flags_known(obj,pcVar11->f);
      }
    }
    goto LAB_001d3392;
  }
  if (local_c1 == 0) {
    (*combiner.finish_func)(&cst);
    wVar16 = cst.accum;
    if ((cst.accum == local_a4) && (wVar16 = local_a4, bVar5)) goto LAB_001d380c;
  }
  else {
    if (bVar3) {
      wVar16 = L'\x7fffffff';
      if (bVar4) {
        wVar16 = local_a4;
      }
      *val = wVar16;
      cst.accum_aux = local_a4;
      if (bVar6) {
        cst.accum_aux = L'\x7fffffff';
      }
      goto LAB_001d384b;
    }
    (*combiner.finish_func)(&cst);
LAB_001d380c:
    wVar16 = L'\x7fffffff';
    if (bVar4) {
      wVar16 = local_a4;
    }
  }
  *val = wVar16;
  if (((bVar3) || ((cst.accum_aux == local_a4 && (bVar5)))) && (cst.accum_aux = local_a4, bVar6)) {
    cst.accum_aux = L'\x7fffffff';
  }
LAB_001d384b:
  *auxval = cst.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_object(const struct ui_entry *entry,
	const struct object *obj, const struct player *p,
	struct cached_object_data **cache, int *val, int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	const struct curse_data *curse;
	struct cached_object_data *cache2;
	bool first, all_unknown, all_aux_unknown, any_aux, all_aux;
	bool any_curse_unknown;
	int curse_ind;
	int base = 0;

	if (!obj || !entry->n_obj_prop) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		of_wipe((*cache)->f);
		if (p) {
			object_flags_known(obj, (*cache)->f);
		} else {
			object_flags(obj, (*cache)->f);
		}
	}
	first = true;
	all_unknown = true;
	all_aux_unknown = true;
	any_aux = false;
	all_aux = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	cache2 = *cache;
	curse = obj->curses;
	any_curse_unknown = false;
	curse_ind = 0;
	while (obj) {
		int i;

		for (i = 0; i < entry->n_obj_prop; ++i) {
			int ind = entry->obj_props[i].index;

			if (entry->obj_props[i].isaux) {
				if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
					continue;
				}
				any_aux = true;
			} else {
				all_aux = false;
			}

			switch (entry->obj_props[i].type) {
			case OBJ_PROPERTY_STAT:
			case OBJ_PROPERTY_MOD:
				if (!p || p->obj_k->modifiers[ind] != 0 ||
					obj->modifiers[ind] == 0) {
					int v = obj->modifiers[ind];
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_FLAG:
				if (!p || object_flag_is_known(p, obj, ind)) {
					int v = of_has(cache2->f, ind) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_IGNORE:
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = (obj->el_info[ind].flags &
						EL_INFO_IGNORE) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_ELEMENT:
				base = RES_LEVEL_BASE;
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = obj->el_info[ind].res_level;
					int a = RES_LEVEL_BASE;

					if (v != base && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			default:
				break;
			}
		}

		if (curse) {
			/*
			 * Proceed to the next unprocessed curse object.
			 * Don't overwrite the cached data for the base.
			 */
			obj = NULL;
			if (curse_ind == 0) {
				cache2 = mem_alloc(sizeof(*cache2));
			}
			++curse_ind;
			while (1) {
				if (curse_ind >= z_info->curse_max) {
					mem_free(cache2);
					break;
				}
				if (curse[curse_ind].power) {
					obj = curses[curse_ind].obj;
					of_wipe(cache2->f);
					if (p) {
						object_flags_known(obj,
							cache2->f);
					} else {
						object_flags(obj, cache2->f);
					}
					break;
				}
				++curse_ind;
			}
		} else {
			obj = NULL;
		}
	}
	if (all_unknown && all_aux_unknown) {
		*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
	} else {
		(*combiner.finish_func)(&cst);
		if (all_unknown || (cst.accum == base && any_curse_unknown)) {
			*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		} else {
			*val = cst.accum;
		}
		if (all_aux_unknown || (cst.accum_aux == base && any_curse_unknown)) {
			*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
		} else {
			*auxval = cst.accum_aux;
		}
	}
}